

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

char * httplib::detail::status_message(int status)

{
  char *pcStack_10;
  int status_local;
  
  if (status == 200) {
    pcStack_10 = "OK";
  }
  else if (status == 0xcc) {
    pcStack_10 = "No Content";
  }
  else if (status == 0xce) {
    pcStack_10 = "Partial Content";
  }
  else if (status == 0x12d) {
    pcStack_10 = "Moved Permanently";
  }
  else if (status == 0x12e) {
    pcStack_10 = "Found";
  }
  else if (status == 0x12f) {
    pcStack_10 = "See Other";
  }
  else if (status == 0x130) {
    pcStack_10 = "Not Modified";
  }
  else if (status == 400) {
    pcStack_10 = "Bad Request";
  }
  else if (status == 0x191) {
    pcStack_10 = "Unauthorized";
  }
  else if (status == 0x193) {
    pcStack_10 = "Forbidden";
  }
  else if (status == 0x194) {
    pcStack_10 = "Not Found";
  }
  else if (status == 0x19d) {
    pcStack_10 = "Payload Too Large";
  }
  else if (status == 0x19e) {
    pcStack_10 = "Request-URI Too Long";
  }
  else if (status == 0x19f) {
    pcStack_10 = "Unsupported Media Type";
  }
  else if (status == 0x1a0) {
    pcStack_10 = "Range Not Satisfiable";
  }
  else {
    pcStack_10 = "Internal Server Error";
  }
  return pcStack_10;
}

Assistant:

inline const char *status_message(int status) {
  switch (status) {
  case 200: return "OK";
  case 204: return "No Content";
  case 206: return "Partial Content";
  case 301: return "Moved Permanently";
  case 302: return "Found";
  case 303: return "See Other";
  case 304: return "Not Modified";
  case 400: return "Bad Request";
  case 401: return "Unauthorized";
  case 403: return "Forbidden";
  case 404: return "Not Found";
  case 413: return "Payload Too Large";
  case 414: return "Request-URI Too Long";
  case 415: return "Unsupported Media Type";
  case 416: return "Range Not Satisfiable";

  default:
  case 500: return "Internal Server Error";
  }
}